

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseBitVector.h
# Opt level: O2

BVSparseNode * __thiscall
BVSparse<Memory::Recycler>::NodeFromIndex
          (BVSparse<Memory::Recycler> *this,BVIndex i,Type **prevNextFieldOut)

{
  uint uVar1;
  BVSparse<Memory::Recycler> *pBVar2;
  uint uVar3;
  BVSparse<Memory::Recycler> *pBVar4;
  BVSparse<Memory::Recycler> *pBVar5;
  BVSparse<Memory::Recycler> *pBVar6;
  Type *this_00;
  uint uVar7;
  
  uVar7 = i & 0xffffffc0;
  this_00 = &this->lastFoundIndex;
  pBVar2 = (BVSparse<Memory::Recycler> *)(this->head).ptr;
  pBVar6 = this;
  if (pBVar2 == (BVSparse<Memory::Recycler> *)0x0) {
    pBVar4 = (BVSparse<Memory::Recycler> *)0x0;
  }
  else {
    uVar3 = *(uint *)&(pBVar2->lastFoundIndex).ptr;
    pBVar4 = pBVar2;
    if (uVar3 == uVar7) goto LAB_009fe10a;
    pBVar5 = (BVSparse<Memory::Recycler> *)(this->lastFoundIndex).ptr;
    if ((pBVar5 != (BVSparse<Memory::Recycler> *)0x0) &&
       (uVar1 = *(uint *)&(pBVar5->lastFoundIndex).ptr, uVar1 != uVar3)) {
      if (uVar1 == uVar7) {
        *prevNextFieldOut = this_00;
        return (BVSparseNode *)pBVar5;
      }
      pBVar6 = (BVSparse<Memory::Recycler> *)this_00;
      if (uVar7 <= uVar1) {
        pBVar5 = pBVar2;
        pBVar6 = this;
      }
      uVar3 = *(uint *)&(pBVar5->lastFoundIndex).ptr;
      pBVar4 = pBVar5;
    }
    if (uVar7 < uVar3) {
      pBVar6 = this;
      pBVar4 = pBVar2;
    }
  }
  while( true ) {
    if (pBVar4 == (BVSparse<Memory::Recycler> *)0x0) {
      Memory::WriteBarrierPtr<BVSparseNode<Memory::Recycler>_>::operator=(this_00,&pBVar6->head);
      return (BVSparseNode *)0x0;
    }
    if (uVar7 <= *(uint *)&(pBVar4->lastFoundIndex).ptr) break;
    pBVar6 = pBVar4;
    pBVar4 = (BVSparse<Memory::Recycler> *)(pBVar4->head).ptr;
  }
  Memory::WriteBarrierPtr<BVSparseNode<Memory::Recycler>_>::operator=(this_00,&pBVar6->head);
  if (uVar7 != *(Type *)&(pBVar4->lastFoundIndex).ptr) {
    return (BVSparseNode *)0x0;
  }
LAB_009fe10a:
  *prevNextFieldOut = &pBVar6->head;
  return (BVSparseNode *)pBVar4;
}

Assistant:

const BVSparseNode<TAllocator> *
BVSparse<TAllocator>::NodeFromIndex(BVIndex i, Field(BVSparseNode*, TAllocator) const** prevNextFieldOut) const
{
    const BVIndex searchIndex = SparseBVUnit::Floor(i);

    Field(BVSparseNode*, TAllocator) const* prevNextField = &this->head;
    Field(BVSparseNode*, TAllocator) const* prevLastField = &this->lastFoundIndex;

    const BVSparseNode * curNode  = *prevNextField,
                       * lastNode = *prevLastField;
    if (curNode != nullptr)
    {
        if (curNode->startIndex == searchIndex)
        {
            *prevNextFieldOut = prevNextField;
            return curNode;
        }

        if (lastNode && lastNode->startIndex != curNode->startIndex)
        {
            if (lastNode->startIndex == searchIndex)
            {
                *prevNextFieldOut = prevLastField;
                return lastNode;
            }

            if (lastNode->startIndex < searchIndex)
            {
                prevNextField = &this->lastFoundIndex;
                curNode = this->lastFoundIndex;
            }
        }

        if (curNode->startIndex > searchIndex)
        {
            prevNextField = &this->head;
            curNode = this->head;
        }
    }
    else
    {
        prevNextField = &this->head;
        curNode = this->head;
    }

    for (; curNode && searchIndex > curNode->startIndex; curNode = curNode->next)
    {
        prevNextField = &curNode->next;
    }

    const_cast<BVSparse<TAllocator>*>(this)->lastFoundIndex = *prevNextField;

    if (curNode && searchIndex == curNode->startIndex)
    {
        *prevNextFieldOut = prevNextField;
        return curNode;
    }

    return nullptr;
}